

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_update_alleles_str(bcf_hdr_t *hdr,bcf1_t *line,char *alleles_string)

{
  char *pcVar1;
  int nals;
  bcf1_t *line_00;
  kstring_t tmp;
  
  tmp.l = 0;
  tmp.s = (line->d).als;
  tmp.m = (size_t)(line->d).m_als;
  kputs(alleles_string,&tmp);
  (line->d).als = tmp.s;
  (line->d).m_als = (int)tmp.m;
  line_00 = (bcf1_t *)0x1;
  pcVar1 = tmp.s;
  do {
    if (*pcVar1 == ',') {
      *pcVar1 = '\0';
      line_00 = (bcf1_t *)(ulong)((int)line_00 + 1);
    }
    else if (*pcVar1 == '\0') {
      _bcf1_sync_alleles((bcf_hdr_t *)line,line_00,nals);
      return 0;
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

int bcf_update_alleles_str(const bcf_hdr_t *hdr, bcf1_t *line, const char *alleles_string)
{
    kstring_t tmp;
    tmp.l = 0; tmp.s = line->d.als; tmp.m = line->d.m_als;
    kputs(alleles_string, &tmp);
    line->d.als = tmp.s; line->d.m_als = tmp.m;

    int nals = 1;
    char *t = line->d.als;
    while (*t)
    {
        if ( *t==',' ) { *t = 0; nals++; }
        t++;
    }
    return _bcf1_sync_alleles(hdr, line, nals);
}